

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UChar * utext_strFromUTF8(UChar *dest,int32_t destCapacity,int32_t *pDestLength,char *src,
                         int32_t srcLength,UErrorCode *pErrorCode)

{
  int iVar1;
  UChar *pUVar2;
  UChar *local_68;
  uint8_t *pSrc;
  int32_t local_50;
  int32_t reqLength;
  int32_t index;
  UChar32 ch;
  UChar *pDestLimit;
  UChar *pDest;
  UErrorCode *pErrorCode_local;
  char *pcStack_28;
  int32_t srcLength_local;
  char *src_local;
  int32_t *pDestLength_local;
  UChar *pUStack_10;
  int32_t destCapacity_local;
  UChar *dest_local;
  
  if (dest == (UChar *)0x0) {
    local_68 = (UChar *)0x0;
  }
  else {
    local_68 = dest + destCapacity;
  }
  _index = local_68;
  reqLength = 0;
  local_50 = 0;
  pSrc._4_4_ = 0;
  pDestLimit = dest;
  pDest = (UChar *)pErrorCode;
  pErrorCode_local._4_4_ = srcLength;
  pcStack_28 = src;
  src_local = (char *)pDestLength;
  pDestLength_local._4_4_ = destCapacity;
  pUStack_10 = dest;
LAB_0021074f:
  do {
    if (pErrorCode_local._4_4_ <= local_50 || _index <= pDestLimit) {
LAB_00210855:
      while (local_50 < pErrorCode_local._4_4_) {
        reqLength = (int32_t)(byte)src[local_50];
        if ((uint)reqLength < 0x80) {
          pSrc._4_4_ = pSrc._4_4_ + 1;
          local_50 = local_50 + 1;
        }
        else {
          local_50 = local_50 + 1;
          reqLength = utf8_nextCharSafeBody_63
                                ((uint8_t *)src,&local_50,pErrorCode_local._4_4_,reqLength,-3);
          iVar1 = 2;
          if ((uint)reqLength < 0x10000) {
            iVar1 = 1;
          }
          pSrc._4_4_ = iVar1 + pSrc._4_4_;
        }
      }
      iVar1 = (int)((long)pDestLimit - (long)pUStack_10 >> 1) + pSrc._4_4_;
      if (src_local != (char *)0x0) {
        *(int *)src_local = iVar1;
      }
      u_terminateUChars_63(pUStack_10,pDestLength_local._4_4_,iVar1,(UErrorCode *)pDest);
      return pUStack_10;
    }
    reqLength = (int32_t)(byte)src[local_50];
    if ((uint)reqLength < 0x80) {
      *pDestLimit = (ushort)(byte)src[local_50];
      local_50 = local_50 + 1;
      pDestLimit = pDestLimit + 1;
      goto LAB_0021074f;
    }
    local_50 = local_50 + 1;
    reqLength = utf8_nextCharSafeBody_63
                          ((uint8_t *)src,&local_50,pErrorCode_local._4_4_,reqLength,-3);
    if ((uint)reqLength < 0x10000) {
      *pDestLimit = (UChar)reqLength;
      pDestLimit = pDestLimit + 1;
    }
    else {
      pUVar2 = pDestLimit + 1;
      *pDestLimit = (short)(reqLength >> 10) + L'ퟀ';
      if (_index <= pUVar2) {
        pSrc._4_4_ = 1;
        pDestLimit = pUVar2;
        goto LAB_00210855;
      }
      pDestLimit = pDestLimit + 2;
      *pUVar2 = (UChar)reqLength & 0x3ffU | 0xdc00;
    }
  } while( true );
}

Assistant:

static UChar*
utext_strFromUTF8(UChar *dest,
              int32_t destCapacity,
              int32_t *pDestLength,
              const char* src,
              int32_t srcLength,        // required.  NUL terminated not supported.
              UErrorCode *pErrorCode
              )
{

    UChar *pDest = dest;
    UChar *pDestLimit = (dest!=NULL)?(dest+destCapacity):NULL;
    UChar32 ch=0;
    int32_t index = 0;
    int32_t reqLength = 0;
    uint8_t* pSrc = (uint8_t*) src;


    while((index < srcLength)&&(pDest<pDestLimit)){
        ch = pSrc[index++];
        if(ch <=0x7f){
            *pDest++=(UChar)ch;
        }else{
            ch=utf8_nextCharSafeBody(pSrc, &index, srcLength, ch, -3);
            if(U_IS_BMP(ch)){
                *(pDest++)=(UChar)ch;
            }else{
                *(pDest++)=U16_LEAD(ch);
                if(pDest<pDestLimit){
                    *(pDest++)=U16_TRAIL(ch);
                }else{
                    reqLength++;
                    break;
                }
            }
        }
    }
    /* donot fill the dest buffer just count the UChars needed */
    while(index < srcLength){
        ch = pSrc[index++];
        if(ch <= 0x7f){
            reqLength++;
        }else{
            ch=utf8_nextCharSafeBody(pSrc, &index, srcLength, ch, -3);
            reqLength+=U16_LENGTH(ch);
        }
    }

    reqLength+=(int32_t)(pDest - dest);

    if(pDestLength){
        *pDestLength = reqLength;
    }

    /* Terminate the buffer */
    u_terminateUChars(dest,destCapacity,reqLength,pErrorCode);

    return dest;
}